

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_drop(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  object *obj;
  wchar_t amt;
  object *local_20;
  wchar_t local_14;
  
  _Var1 = player_get_resume_normal_shape(player,cmd);
  if ((_Var1) &&
     (wVar2 = cmd_get_item((command_conflict *)cmd,"item",&local_20,"Drop which item?",
                           "You have nothing to drop.",(item_tester)0x0,L'\v'), wVar2 == L'\0')) {
    _Var1 = object_is_equipped(player->body,local_20);
    if ((_Var1) && (_Var1 = obj_can_takeoff(local_20), !_Var1)) {
      msg("Hmmm, it seems to be stuck.");
      return;
    }
    wVar2 = cmd_get_quantity((command_conflict *)cmd,"quantity",&local_14,(uint)local_20->number);
    if (wVar2 == L'\0') {
      inven_drop(local_20,local_14);
      player->upkeep->energy_use = (uint)(z_info->move_energy >> 1);
    }
  }
  return;
}

Assistant:

void do_cmd_drop(struct command *cmd)
{
	int amt;
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Drop which item?",
			/* Error  */ "You have nothing to drop.",
			/* Filter */ NULL,
			/* Choice */ USE_EQUIP | USE_INVEN | USE_QUIVER) != CMD_OK)
		return;

	/* Cannot remove stickied items */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	inven_drop(obj, amt);
	player->upkeep->energy_use = z_info->move_energy / 2;
}